

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despot.cpp
# Opt level: O3

VNode * despot::DESPOT::SelectBestWEUNode(QNode *qnode)

{
  VNode *vnode;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *pmVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Self __tmp;
  VNode *pVVar4;
  double dVar5;
  double local_30;
  
  pmVar1 = QNode::children(qnode);
  p_Var2 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    pVVar4 = (VNode *)0x0;
  }
  else {
    local_30 = -INFINITY;
    pVVar4 = (VNode *)0x0;
    do {
      vnode = (VNode *)p_Var2[1]._M_parent;
      dVar5 = WEU(vnode,DAT_00192dd8);
      if (local_30 <= dVar5) {
        pVVar4 = vnode->vstar;
        local_30 = dVar5;
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  return pVVar4;
}

Assistant:

VNode* DESPOT::SelectBestWEUNode(QNode* qnode) {
	double weustar = Globals::NEG_INFTY;
	VNode* vstar = NULL;
	map<OBS_TYPE, VNode*>& children = qnode->children();
	for (map<OBS_TYPE, VNode*>::iterator it = children.begin();
		it != children.end(); it++) {
		VNode* vnode = it->second;

		double weu = WEU(vnode);
		if (weu >= weustar) {
			weustar = weu;
			vstar = vnode->vstar;
		}
	}
	return vstar;
}